

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void print_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,int newln_p)

{
  byte bVar1;
  VARR_mem_attr_t *pVVar2;
  char *pcVar3;
  ulong uVar4;
  uint32_t *puVar5;
  ulong uVar6;
  
  MIR_output_insn(gen_ctx->ctx,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
  puVar5 = &insn->ops[0].u.mem.nloc;
  uVar6 = 0;
  do {
    if (*(uint *)&insn->field_0x1c <= uVar6) {
      if (newln_p != 0) {
        fputc(10,(FILE *)gen_ctx->debug_file);
        return;
      }
      return;
    }
    if (*puVar5 != 0 && (char)puVar5[-5] == '\v') {
      pVVar2 = gen_ctx->mem_attrs;
      if (((pVVar2 == (VARR_mem_attr_t *)0x0) || (pVVar2->varr == (mem_attr_t *)0x0)) ||
         (uVar4 = (ulong)*puVar5, pVVar2->els_num <= uVar4)) {
        mir_varr_assert_fail("get","mem_attr_t");
      }
      bVar1 = pVVar2->varr[uVar4].alloca_flag;
      pcVar3 = "u";
      if ((bVar1 & 3) != 0) {
        pcVar3 = "au";
      }
      if (bVar1 == 0) {
        pcVar3 = "";
      }
      fprintf((FILE *)gen_ctx->debug_file," # m%lu%s",uVar4,pcVar3);
    }
    uVar6 = uVar6 + 1;
    puVar5 = puVar5 + 0xc;
  } while( true );
}

Assistant:

static void print_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, int newln_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  int flag;
  MIR_op_t op;

  MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
  for (size_t i = 0; i < insn->nops; i++) {
    op = insn->ops[i];
    if (op.mode == MIR_OP_VAR_MEM && op.u.var_mem.nloc != 0) {
      flag = VARR_GET (mem_attr_t, mem_attrs, op.u.var_mem.nloc).alloca_flag;
      fprintf (debug_file, " # m%lu%s", (unsigned long) op.u.var_mem.nloc,
               !flag                               ? ""
               : flag & (MAY_ALLOCA | MUST_ALLOCA) ? "au"
               : flag & MAY_ALLOCA                 ? "a"
                                                   : "u");
    }
  }
  if (newln_p) fprintf (debug_file, "\n");
}